

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  value_type vVar1;
  ostream *poVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  int local_56c;
  int i_2;
  undefined1 local_4f0 [8];
  Array_Data_Symbol source;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_470;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_468;
  const_iterator local_460;
  Vector_Data_DEF *local_458;
  __normal_iterator<Vector_Data_DEF_*,_std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>_>
  local_450;
  __normal_iterator<Vector_Data_DEF_*,_std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>_>
  local_448;
  const_iterator local_440;
  int local_434;
  undefined1 local_430 [4];
  int loss;
  R10_Decoder decoder;
  vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> local_218;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  undefined1 local_1f0 [4];
  int i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ESI;
  Array_Data_Symbol D;
  undefined1 local_150 [8];
  LT_Encoding encoder;
  undefined1 local_a0 [4];
  int i;
  Array_Data_Symbol testing_symbol;
  int overhead;
  int SYMBOL_SIZE;
  int SYMBOL_LEN;
  char **argv_local;
  int argc_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Raptor Codes Testing !");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  testing_symbol._116_4_ = 3;
  Array_Data_Symbol::Array_Data_Symbol((Array_Data_Symbol *)local_a0,0x400,1);
  for (encoder.C._116_4_ = 0; (uint)encoder.C._116_4_ < testing_symbol.L;
      encoder.C._116_4_ = encoder.C._116_4_ + 1) {
    if ((int)encoder.C._116_4_ % 3 != 0) {
      pvVar3 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                         ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)
                          &testing_symbol.ESIs.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)(int)encoder.C._116_4_);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&pvVar3->s,0);
      *pvVar4 = '\x01';
    }
  }
  LT_Encoding::LT_Encoding((LT_Encoding *)local_150,(Array_Data_Symbol *)local_a0);
  Array_Data_Symbol::Array_Data_Symbol
            ((Array_Data_Symbol *)
             &ESI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,testing_symbol.L,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f0);
  for (local_1f4 = 0; local_1f4 < testing_symbol.L + 3; local_1f4 = local_1f4 + 1) {
    local_1f8 = local_1f4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f0,&local_1f8);
    local_1fc = local_1f4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&D.LP,&local_1fc);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &decoder.precomput_param.D_p._sym_len,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f0);
  LT_Encoding::LTEnc_Generate
            (&local_218,(LT_Encoding *)local_150,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &decoder.precomput_param.D_p._sym_len);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator=
            ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)
             &D.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_218);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::~vector(&local_218);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &decoder.precomput_param.D_p._sym_len);
  R10_Decoder::R10_Decoder((R10_Decoder *)local_430,testing_symbol.L,1);
  local_434 = 1;
  this = &D.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  local_450._M_current =
       (Vector_Data_DEF *)
       std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::begin
                 ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)this);
  local_448 = __gnu_cxx::
              __normal_iterator<Vector_Data_DEF_*,_std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>_>
              ::operator+(&local_450,3);
  __gnu_cxx::
  __normal_iterator<Vector_Data_DEF_const*,std::vector<Vector_Data_DEF,std::allocator<Vector_Data_DEF>>>
  ::__normal_iterator<Vector_Data_DEF*>
            ((__normal_iterator<Vector_Data_DEF_const*,std::vector<Vector_Data_DEF,std::allocator<Vector_Data_DEF>>>
              *)&local_440,&local_448);
  local_458 = (Vector_Data_DEF *)
              std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::erase
                        ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)this,local_440
                        );
  local_470._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&D.LP);
  local_468 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator+(&local_470,3);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              *)&local_460,&local_468);
  source._112_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&D.LP,local_460);
  Array_Data_Symbol::Array_Data_Symbol
            ((Array_Data_Symbol *)&stack0xfffffffffffffa98,
             (Array_Data_Symbol *)
             &ESI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  R10_Decoder::Get_Source_Symbol
            ((Array_Data_Symbol *)local_4f0,(R10_Decoder *)local_430,
             (Array_Data_Symbol *)&stack0xfffffffffffffa98,(testing_symbol.L - local_434) + 3);
  Array_Data_Symbol::~Array_Data_Symbol((Array_Data_Symbol *)&stack0xfffffffffffffa98);
  local_56c = 0;
  do {
    sVar5 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::size
                      ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)
                       &source.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar5 <= (ulong)(long)local_56c) {
      poVar2 = std::operator<<((ostream *)&std::cout,"decode successfully!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"total symbols: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,source.L);
      poVar2 = std::operator<<(poVar2,"  redundancy rate: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0.0029296875);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 0;
LAB_00123da3:
      Array_Data_Symbol::~Array_Data_Symbol((Array_Data_Symbol *)local_4f0);
      R10_Decoder::~R10_Decoder((R10_Decoder *)local_430);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f0);
      Array_Data_Symbol::~Array_Data_Symbol
                ((Array_Data_Symbol *)
                 &ESI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      LT_Encoding::~LT_Encoding((LT_Encoding *)local_150);
      Array_Data_Symbol::~Array_Data_Symbol((Array_Data_Symbol *)local_a0);
      return argv_local._4_4_;
    }
    pvVar3 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                       ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)
                        &source.ESIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_56c);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&pvVar3->s,0);
    vVar1 = *pvVar4;
    pvVar3 = std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator[]
                       ((vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_> *)
                        &testing_symbol.ESIs.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_56c);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&pvVar3->s,0);
    if ((bool)vVar1 != (*pvVar4 != '\0')) {
      poVar2 = std::operator<<((ostream *)&std::cout,"decode fail!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
      goto LAB_00123da3;
    }
    local_56c = local_56c + 1;
  } while( true );
}

Assistant:

int main(int argc, char const *argv[])
{
	std::cout << "Raptor Codes Testing !" << std::endl;	


    const int SYMBOL_LEN = 1;
    const int SYMBOL_SIZE = 1024;
    const int overhead = 3;


	class Array_Data_Symbol testing_symbol(SYMBOL_SIZE, SYMBOL_LEN);

	for (int i = 0; i < testing_symbol.K; ++i)
	{
		// if (i%2)
		// {
		// 	a.symbol[i].s[0] = 1;
		// }
		if (i%3)
		{
			testing_symbol.symbol[i].s[0] = 1;
		}		
	}




    class LT_Encoding encoder(&testing_symbol);


   	class Array_Data_Symbol D(testing_symbol.K, SYMBOL_LEN);

    std::vector<uint32_t> ESI;

    for (int i = 0; i < testing_symbol.K + overhead; ++i)
    {
    	ESI.push_back(i);
    	D.ESIs.push_back(i);
    }




    // for (int i = 0; i < ESI.size(); ++i)
    // {
    // 	printf("ESI: %d\n", ESI[i]);
    // }

	//printf("ESI: %d\n", ESI.size());

    D.symbol = encoder.LTEnc_Generate(ESI);


	class R10_Decoder decoder(testing_symbol.K, SYMBOL_LEN);

	// class Array_Data_Symbol C = decoder.Get_Inter_Symbols(D, testing_symbol.K);


 //    std::cout << "testing_symbol: " << std::endl;
 //    for (int i = 0; i < testing_symbol.K; ++i)
 //    {
 //        printf("%d ", testing_symbol.symbol[i].s[0]);
 //    }
 //    std::cout << std::endl;

 //     printf("D: \n");

 //    for (int i = 0; i < D.symbol.size(); ++i)
 //    {
 //        printf("%d ", D.symbol[i].s[0]);
 //    }
 //    printf("\n");

	// printf("C: \n");

	// for (int i = 0; i < C.symbol.size(); ++i)
	// {
	// 	printf("%d ", C.symbol[i].s[0]);
	// }
	// printf("\n");


    // decoder.Inter_Symbols_Decoding(C);

    // drop some symbols for testing
     int loss = 1;
    D.symbol.erase(D.symbol.begin() + 3);
    D.ESIs.erase(D.ESIs.begin() + 3);



   class Array_Data_Symbol source = decoder.Get_Source_Symbol(D, testing_symbol.K + overhead - loss);


    // printf("Source Symbol: \n");

    // for (int i = 0; i < source.symbol.size(); ++i)
    // {
    //     printf("%d ", source.symbol[i].s[0]);
    // }
    // printf("\n");


    // std::cout << "Testing Symbol: " << std::endl;
    // for (int i = 0; i < testing_symbol.K; ++i)
    // {
    //     printf("%d ", testing_symbol.symbol[i].s[0]);
    // }
    // std::cout << std::endl;


   for (int i = 0; i < source.symbol.size(); ++i)
   {
        if (source.symbol[i].s[0] ^ testing_symbol.symbol[i].s[0] != 0)
        {

             std::cout << "decode fail!" << std::endl;
             return -1;

        }

   }


    std::cout << "decode successfully!" << std::endl;
    std::cout <<  "total symbols: " << source.K <<"  redundancy rate: " <<  (float)overhead / (float)SYMBOL_SIZE <<std::endl;


	return 0;
}